

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngrtran.c
# Opt level: O3

void png_set_gamma_fixed(png_structrp png_ptr,png_fixed_point scrn_gamma,png_fixed_point file_gamma)

{
  png_uint_16 *ppVar1;
  uint uVar2;
  uint uVar3;
  png_fixed_point pVar4;
  
  if (png_ptr == (png_structrp)0x0) {
    return;
  }
  uVar2 = png_ptr->flags;
  if ((uVar2 & 0x40) != 0) {
    png_app_error(png_ptr,"invalid after png_start_read_image or png_read_update_info");
    return;
  }
  uVar3 = uVar2 | 0x4000;
  png_ptr->flags = uVar3;
  if (scrn_gamma < -2) {
    if (scrn_gamma == -100000) {
LAB_00117e49:
      uVar3 = uVar2 | 0x5000;
      png_ptr->flags = uVar3;
      scrn_gamma = 220000;
    }
    else if (scrn_gamma == -50000) goto LAB_00117e5e;
  }
  else {
    if (scrn_gamma != -2) {
      if (scrn_gamma != -1) goto LAB_00117e63;
      goto LAB_00117e49;
    }
LAB_00117e5e:
    scrn_gamma = 0x250ac;
  }
LAB_00117e63:
  pVar4 = 0x10175;
  if (file_gamma < -2) {
    if (file_gamma == -100000) {
LAB_00117e89:
      png_ptr->flags = uVar3 | 0x1000;
      pVar4 = 0xb18f;
      goto LAB_00117ea1;
    }
    if (file_gamma == -50000) goto LAB_00117ea1;
  }
  else {
    if (file_gamma == -2) goto LAB_00117ea1;
    if (file_gamma == -1) goto LAB_00117e89;
  }
  pVar4 = file_gamma;
  if (file_gamma < 1) {
    png_error(png_ptr,"invalid file gamma in png_set_gamma");
  }
LAB_00117ea1:
  if (0 < scrn_gamma) {
    (png_ptr->colorspace).gamma = pVar4;
    ppVar1 = &(png_ptr->colorspace).flags;
    *(byte *)ppVar1 = (byte)*ppVar1 | 1;
    png_ptr->screen_gamma = scrn_gamma;
    return;
  }
  png_error(png_ptr,"invalid screen gamma in png_set_gamma");
}

Assistant:

void PNGFAPI
png_set_gamma_fixed(png_structrp png_ptr, png_fixed_point scrn_gamma,
    png_fixed_point file_gamma)
{
   png_debug(1, "in png_set_gamma_fixed");

   if (png_rtran_ok(png_ptr, 0) == 0)
      return;

   /* New in libpng-1.5.4 - reserve particular negative values as flags. */
   scrn_gamma = translate_gamma_flags(png_ptr, scrn_gamma, 1/*screen*/);
   file_gamma = translate_gamma_flags(png_ptr, file_gamma, 0/*file*/);

   /* Checking the gamma values for being >0 was added in 1.5.4 along with the
    * premultiplied alpha support; this actually hides an undocumented feature
    * of the previous implementation which allowed gamma processing to be
    * disabled in background handling.  There is no evidence (so far) that this
    * was being used; however, png_set_background itself accepted and must still
    * accept '0' for the gamma value it takes, because it isn't always used.
    *
    * Since this is an API change (albeit a very minor one that removes an
    * undocumented API feature) the following checks were only enabled in
    * libpng-1.6.0.
    */
   if (file_gamma <= 0)
      png_error(png_ptr, "invalid file gamma in png_set_gamma");

   if (scrn_gamma <= 0)
      png_error(png_ptr, "invalid screen gamma in png_set_gamma");

   /* Set the gamma values unconditionally - this overrides the value in the PNG
    * file if a gAMA chunk was present.  png_set_alpha_mode provides a
    * different, easier, way to default the file gamma.
    */
   png_ptr->colorspace.gamma = file_gamma;
   png_ptr->colorspace.flags |= PNG_COLORSPACE_HAVE_GAMMA;
   png_ptr->screen_gamma = scrn_gamma;
}